

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerVk.hpp
# Opt level: O0

void __thiscall
Diligent::ShaderVariableVkImpl::BindResource(ShaderVariableVkImpl *this,BindResourceInfo *BindInfo)

{
  BindResourceInfo *BindInfo_local;
  ShaderVariableVkImpl *this_local;
  
  ShaderVariableManagerVk::BindResource
            ((this->
             super_ShaderVariableBase<Diligent::ShaderVariableVkImpl,_Diligent::ShaderVariableManagerVk,_Diligent::IShaderResourceVariable>
             ).m_ParentManager,
             (this->
             super_ShaderVariableBase<Diligent::ShaderVariableVkImpl,_Diligent::ShaderVariableManagerVk,_Diligent::IShaderResourceVariable>
             ).m_ResIndex,BindInfo);
  return;
}

Assistant:

void BindResource(const BindResourceInfo& BindInfo) const
    {
        m_ParentManager.BindResource(m_ResIndex, BindInfo);
    }